

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldMap.cpp
# Opt level: O0

void __thiscall FIX::FieldMap::addGroupPtr(FieldMap *this,int tag,FieldMap *group,bool setCount)

{
  int field;
  size_type sVar1;
  FieldBase local_88;
  vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_> *local_30;
  vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_> *groups;
  FieldMap *pFStack_20;
  bool setCount_local;
  FieldMap *group_local;
  FieldMap *pFStack_10;
  int tag_local;
  FieldMap *this_local;
  
  if (group != (FieldMap *)0x0) {
    groups._7_1_ = setCount;
    pFStack_20 = group;
    group_local._4_4_ = tag;
    pFStack_10 = this;
    local_30 = std::
               map<int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>_>
               ::operator[](&this->m_groups,(key_type *)((long)&group_local + 4));
    std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>::push_back
              (local_30,&stack0xffffffffffffffe0);
    field = group_local._4_4_;
    if ((groups._7_1_ & 1) != 0) {
      sVar1 = std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>::size(local_30);
      IntField::IntField((IntField *)&local_88,field,(int)sVar1);
      setField(this,&local_88,true);
      IntField::~IntField((IntField *)&local_88);
    }
  }
  return;
}

Assistant:

void FieldMap::addGroupPtr(int tag, FieldMap *group, bool setCount) {
  if (group == 0) {
    return;
  }

  std::vector<FieldMap *> &groups = m_groups[tag];
  groups.push_back(group);

  if (setCount) {
    setField(IntField(tag, (int)groups.size()));
  }
}